

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  uint32 uVar1;
  FeatureType *this;
  Rep *pRVar2;
  ArrayFeatureType_Shape *this_00;
  bool bVar3;
  int iVar4;
  ArrayFeatureType *pAVar5;
  ArrayFeatureType *pAVar6;
  ArrayFeatureType_EnumeratedShapes *pAVar7;
  ImageFeatureType *pIVar8;
  ImageFeatureType_EnumeratedImageSizes *pIVar9;
  DictionaryFeatureType *pDVar10;
  SequenceFeatureType *pSVar11;
  string *psVar12;
  Type *pTVar13;
  ImageFeatureType_ImageSizeRange *pIVar14;
  long *plVar15;
  int64 iVar16;
  Type *pTVar17;
  void **ppvVar18;
  long lVar19;
  ArrayFeatureType_ShapeRange *pAVar20;
  int d;
  int iVar21;
  ArrayFeatureType_ShapeRange *__val;
  RepeatedPtrField<CoreML::Specification::SizeRange> *this_01;
  SizeRange *pSVar22;
  Result *pRVar23;
  string *this_02;
  undefined8 __val_00;
  undefined8 uVar24;
  Result res;
  undefined1 local_138 [40];
  ArrayFeatureType_ShapeRange *local_110;
  undefined1 local_108 [32];
  undefined1 local_e8 [40];
  Result local_c0;
  undefined1 local_98 [32];
  string local_78;
  string local_58;
  ArrayFeatureType_ShapeRange *local_38;
  
  bVar3 = std::operator==((desc->name_).ptr_,"");
  if (bVar3) {
    std::__cxx11::string::string
              ((string *)&res,"Feature description must have a non-empty name.",
               (allocator *)local_138);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    pRVar23 = &res;
    goto LAB_0055a079;
  }
  this = desc->type_;
  if (desc == (FeatureDescription *)&Specification::_FeatureDescription_default_instance_ ||
      this == (FeatureType *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "Feature description ",(desc->name_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   " must specify a valid feature type.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    goto LAB_0055a06a;
  }
  switch(this->_oneof_case_[0]) {
  case 0:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "Feature description has an unspecified or invalid type for feature \'",
                   (desc->name_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "\'.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    break;
  default:
    goto switchD_00559fee_caseD_1;
  case 4:
    pIVar8 = Specification::FeatureType::imagetype(this);
    pAVar20 = (ArrayFeatureType_ShapeRange *)pIVar8->width_;
    pIVar8 = Specification::FeatureType::imagetype(this);
    uVar24 = pIVar8->height_;
    __val = pAVar20;
    local_110 = pAVar20;
    if (2 < modelVersion) {
      pIVar8 = Specification::FeatureType::imagetype(this);
      __val = local_110;
      if (pIVar8->_oneof_case_[0] == 0x1f) {
        local_c0.m_message.field_2._8_8_ = uVar24;
        pIVar8 = Specification::FeatureType::imagetype(this);
        pIVar14 = Specification::ImageFeatureType::imagesizerange(pIVar8);
        pSVar22 = pIVar14->widthrange_;
        if (pSVar22 == (SizeRange *)0x0) {
          pSVar22 = (SizeRange *)&Specification::_SizeRange_default_instance_;
        }
        validateSizeRange(&res,pSVar22);
        bVar3 = Result::good(&res);
        __val_00 = local_c0.m_message.field_2._8_8_;
        if (bVar3) {
          pIVar8 = Specification::FeatureType::imagetype(this);
          pIVar14 = Specification::ImageFeatureType::imagesizerange(pIVar8);
          local_e8._32_8_ = pIVar14->heightrange_;
          if ((SizeRange *)local_e8._32_8_ == (SizeRange *)0x0) {
            local_e8._32_8_ = &Specification::_SizeRange_default_instance_;
          }
          validateSizeRange((Result *)local_138,(SizeRange *)local_e8._32_8_);
          Result::operator=(&res,(Result *)local_138);
          std::__cxx11::string::~string((string *)(local_138 + 8));
          bVar3 = Result::good(&res);
          __val_00 = local_c0.m_message.field_2._8_8_;
          if (!bVar3) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_108 + 0x20),"Description of image feature \'",(desc->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_108 + 0x20),"\' has an invalid flexible height range. ");
            psVar12 = Result::message_abi_cxx11_(&res);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,psVar12);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
            goto LAB_0055ae86;
          }
          if (0 < (long)pAVar20 && 0 < (long)uVar24) {
            if (((long)local_110 < (long)pSVar22->lowerbound_) ||
               ((-1 < (long)pSVar22->upperbound_ &&
                ((ArrayFeatureType_ShapeRange *)pSVar22->upperbound_ < local_110)))) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,"Description of image feature \'",(desc->name_).ptr_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_108 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,"\' default width ");
              std::__cxx11::to_string((string *)local_98,(long)local_110);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_108 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108," is not within specified flexible width range");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
            }
            else {
              if ((long)*(uint64 *)(local_e8._32_8_ + 0x10) <=
                  (long)local_c0.m_message.field_2._8_8_) {
                bVar3 = true;
                uVar24 = local_c0.m_message.field_2._8_8_;
                if (((long)((ShapeFlexibilityUnion *)(local_e8._32_8_ + 0x18))->enumeratedshapes_ <
                     0) || ((ulong)local_c0.m_message.field_2._8_8_ <=
                            ((ShapeFlexibilityUnion *)(local_e8._32_8_ + 0x18))->enumeratedshapes_))
                goto LAB_0055aea9;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,"Description of image feature \'",(desc->name_).ptr_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_108 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,"\' default height ");
              std::__cxx11::to_string((string *)local_98,__val_00);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_108 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108," is not within specified flexible height range");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
            }
            std::__cxx11::string::~string((string *)local_138);
            std::__cxx11::string::~string((string *)local_108);
            std::__cxx11::string::~string((string *)local_98);
            std::__cxx11::string::~string((string *)(local_108 + 0x20));
            pRVar23 = &local_c0;
            goto LAB_0055aea2;
          }
          uVar24 = *(uint64 *)(local_e8._32_8_ + 0x10);
          bVar3 = true;
          local_110 = (ArrayFeatureType_ShapeRange *)pSVar22->lowerbound_;
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),"Description of image feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),"\' has an invalid flexible width range. ");
          psVar12 = Result::message_abi_cxx11_(&res);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,psVar12);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
LAB_0055ae86:
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)local_108);
          pRVar23 = (Result *)(local_108 + 0x20);
LAB_0055aea2:
          std::__cxx11::string::~string((string *)pRVar23);
          bVar3 = false;
          uVar24 = __val_00;
        }
LAB_0055aea9:
        std::__cxx11::string::~string((string *)&res.m_message);
        __val = local_110;
        if (!bVar3) {
          return __return_storage_ptr__;
        }
      }
      else if (pIVar8->_oneof_case_[0] == 0x15) {
        pIVar8 = Specification::FeatureType::imagetype(this);
        pIVar9 = Specification::ImageFeatureType::enumeratedsizes(pIVar8);
        if ((pIVar9->sizes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"Description of image feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"\' has enumerated zero permitted sizes.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          break;
        }
        pIVar8 = Specification::FeatureType::imagetype(this);
        pIVar9 = Specification::ImageFeatureType::enumeratedsizes(pIVar8);
        if (0 < (long)pAVar20 && 0 < (long)uVar24) {
          pRVar2 = (pIVar9->sizes_).super_RepeatedPtrFieldBase.rep_;
          ppvVar18 = pRVar2->elements;
          if (pRVar2 == (Rep *)0x0) {
            ppvVar18 = (void **)0x0;
          }
          for (lVar19 = 0;
              (long)(pIVar9->sizes_).super_RepeatedPtrFieldBase.current_size_ * 8 != lVar19;
              lVar19 = lVar19 + 8) {
            if ((__val == *(ArrayFeatureType_ShapeRange **)
                           (*(long *)((long)ppvVar18 + lVar19) + 0x10)) &&
               ((ArrayFeatureType_EnumeratedShapes *)uVar24 ==
                *(ArrayFeatureType_EnumeratedShapes **)(*(long *)((long)ppvVar18 + lVar19) + 0x18)))
            goto LAB_0055a38a;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"Description of image feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"\' has a default size of ");
          std::__cxx11::to_string((string *)(local_98 + 0x20),(long)__val);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_98 + 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),anon_var_dwarf_506eea);
          std::__cxx11::to_string(&local_58,uVar24);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138," which is not within the allowed enumerated sizes specified.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          goto LAB_0055b09c;
        }
        pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar9->sizes_).super_RepeatedPtrFieldBase,0);
        __val = (ArrayFeatureType_ShapeRange *)pTVar17->width_;
        pIVar8 = Specification::FeatureType::imagetype(this);
        pIVar9 = Specification::ImageFeatureType::enumeratedsizes(pIVar8);
        pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar9->sizes_).super_RepeatedPtrFieldBase,0);
        uVar24 = pTVar17->height_;
      }
    }
LAB_0055a38a:
    if ((long)__val < 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + 0x20),"Description of image feature \'",(desc->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + 0x20),"\' has missing or non-positive width ");
      pIVar8 = Specification::FeatureType::imagetype(this);
      std::__cxx11::to_string((string *)&local_c0,pIVar8->width_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     ".");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    else {
      if (0 < (long)uVar24) {
        pIVar8 = Specification::FeatureType::imagetype(this);
        if (((uint)pIVar8->colorspace_ < 0x1f) &&
           ((0x40100400U >> (pIVar8->colorspace_ & 0x1fU) & 1) != 0)) goto switchD_00559fee_caseD_1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Description of image feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       "\' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
        break;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + 0x20),"Description of image feature \'",(desc->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + 0x20),"\' has missing or non-positive height ");
      pIVar8 = Specification::FeatureType::imagetype(this);
      std::__cxx11::to_string((string *)&local_c0,pIVar8->height_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     ".");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    std::__cxx11::string::~string((string *)&res);
    std::__cxx11::string::~string((string *)local_138);
    pRVar23 = &local_c0;
    goto LAB_0055a5fa;
  case 5:
    pAVar5 = Specification::FeatureType::multiarraytype(this);
    pAVar6 = Specification::FeatureType::multiarraytype(this);
    local_c0.m_message.field_2._8_4_ = (pAVar6->shape_).current_size_;
    if (modelVersion < 3) {
LAB_0055a32c:
      if (isInput && local_c0.m_message.field_2._8_4_ == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"\' has missing shape constraints.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
        break;
      }
LAB_0055ab9a:
      if (local_c0.m_message.field_2._8_4_ != 0) {
        for (iVar21 = 0; pAVar5 = Specification::FeatureType::multiarraytype(this),
            iVar21 < (pAVar5->shape_).current_size_; iVar21 = iVar21 + 1) {
          pAVar5 = Specification::FeatureType::multiarraytype(this);
          iVar16 = Specification::ArrayFeatureType::shape(pAVar5,iVar21);
          if (iVar16 < 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"\' has an invalid shape. Element ");
            std::__cxx11::to_string((string *)(local_98 + 0x20),iVar21);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_108 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_98 + 0x20));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_108 + 0x20)," has non-positive value ");
            std::__cxx11::to_string(&local_58,iVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,&local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,".");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
            goto LAB_0055b09c;
          }
        }
      }
    }
    else {
      pAVar6 = Specification::FeatureType::multiarraytype(this);
      if (pAVar6->_oneof_case_[0] != 0x1f) {
        if (pAVar6->_oneof_case_[0] == 0x15) {
          pAVar6 = Specification::FeatureType::multiarraytype(this);
          pAVar7 = Specification::ArrayFeatureType::enumeratedshapes(pAVar6);
          if ((pAVar7->shapes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,"\' has enumerated zero permitted sizes.");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          }
          else {
            pAVar6 = Specification::FeatureType::multiarraytype(this);
            pAVar7 = Specification::ArrayFeatureType::enumeratedshapes(pAVar6);
            pRVar2 = (pAVar7->shapes_).super_RepeatedPtrFieldBase.rep_;
            ppvVar18 = pRVar2->elements;
            if (pRVar2 == (Rep *)0x0) {
              ppvVar18 = (void **)0x0;
            }
            lVar19 = 0;
            do {
              if ((long)(pAVar7->shapes_).super_RepeatedPtrFieldBase.current_size_ * 8 == lVar19) {
                if (local_c0.m_message.field_2._8_4_ != 0) {
                  pAVar6 = Specification::FeatureType::multiarraytype(this);
                  pAVar7 = Specification::ArrayFeatureType::enumeratedshapes(pAVar6);
                  pRVar2 = (pAVar7->shapes_).super_RepeatedPtrFieldBase.rep_;
                  pAVar20 = (ArrayFeatureType_ShapeRange *)pRVar2->elements;
                  if (pRVar2 == (Rep *)0x0) {
                    pAVar20 = (ArrayFeatureType_ShapeRange *)0x0;
                  }
                  local_38 = (ArrayFeatureType_ShapeRange *)
                             (&pAVar20->super_MessageLite +
                             (pAVar7->shapes_).super_RepeatedPtrFieldBase.current_size_);
                  local_e8._32_8_ = &pAVar5->shape_;
                  while (pAVar20 != local_38) {
                    this_00 = (ArrayFeatureType_Shape *)
                              (pAVar20->super_MessageLite)._vptr_MessageLite;
                    local_110 = pAVar20;
                    if ((this_00->shape_).current_size_ ==
                        *(int *)&((MessageLite *)local_e8._32_8_)->_vptr_MessageLite) {
                      iVar21 = 0;
                      do {
                        if ((this_00->shape_).current_size_ <= iVar21) goto LAB_0055ab9a;
                        plVar15 = google::protobuf::RepeatedField<long>::Get
                                            ((RepeatedField<long> *)local_e8._32_8_,iVar21);
                        lVar19 = *plVar15;
                        iVar16 = Specification::ArrayFeatureType_Shape::shape(this_00,iVar21);
                        iVar21 = iVar21 + 1;
                      } while (lVar19 == iVar16);
                    }
                    pAVar20 = (ArrayFeatureType_ShapeRange *)&local_110->_internal_metadata_;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108,"Description of multiarray feature \'",
                                 (desc->name_).ptr_);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_138,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108,"\' has a default shape specified ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&res,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_138,
                                 " which is not within the allowed enumerated shapes specified.");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
                  std::__cxx11::string::~string((string *)&res);
                  std::__cxx11::string::~string((string *)local_138);
                  pRVar23 = (Result *)local_108;
                  goto LAB_0055a079;
                }
                goto LAB_0055abd2;
              }
              plVar15 = (long *)((long)ppvVar18 + lVar19);
              lVar19 = lVar19 + 8;
            } while (*(int *)(*plVar15 + 0x10) != 0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,"\' has enumerated shapes with zero dimensions.");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          }
          break;
        }
        goto LAB_0055a32c;
      }
      local_e8._32_8_ = &pAVar5->shape_;
      pAVar5 = Specification::FeatureType::multiarraytype(this);
      local_110 = Specification::ArrayFeatureType::shaperange(pAVar5);
      this_01 = &local_110->sizeranges_;
      for (iVar21 = 0; uVar24 = local_e8._32_8_,
          iVar4 = (local_110->sizeranges_).super_RepeatedPtrFieldBase.current_size_, iVar21 < iVar4;
          iVar21 = iVar21 + 1) {
        pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,iVar21);
        validateSizeRange(&res,pTVar13);
        bVar3 = Result::good(&res);
        if (!bVar3) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"\' has an invalid range for dimension ");
          std::__cxx11::to_string((string *)(local_98 + 0x20),iVar21);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_98 + 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),". ");
          psVar12 = Result::message_abi_cxx11_(&res);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,psVar12);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)local_108);
          std::__cxx11::string::~string((string *)(local_108 + 0x20));
          std::__cxx11::string::~string((string *)(local_98 + 0x20));
          std::__cxx11::string::~string((string *)&local_c0);
          this_02 = (string *)local_98;
          goto LAB_0055aa63;
        }
        std::__cxx11::string::~string((string *)&res.m_message);
      }
      if (local_c0.m_message.field_2._8_4_ != 0) {
        if (*(int *)&((MessageLite *)local_e8._32_8_)->_vptr_MessageLite != iVar4) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"\' has a default ");
          std::__cxx11::to_string
                    ((string *)(local_98 + 0x20),*(int *)&((MessageLite *)uVar24)->_vptr_MessageLite
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_98 + 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x20),"-d shape but a ");
          std::__cxx11::to_string
                    (&local_58,(local_110->sizeranges_).super_RepeatedPtrFieldBase.current_size_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"-d shape range");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
LAB_0055b09c:
          std::__cxx11::string::~string((string *)&res);
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)local_108);
          std::__cxx11::string::~string((string *)(local_108 + 0x20));
          std::__cxx11::string::~string((string *)(local_98 + 0x20));
          std::__cxx11::string::~string((string *)&local_c0);
          pRVar23 = (Result *)local_98;
          goto LAB_0055a079;
        }
        for (iVar21 = 0; iVar21 < iVar4; iVar21 = iVar21 + 1) {
          plVar15 = google::protobuf::RepeatedField<long>::Get
                              ((RepeatedField<long> *)local_e8._32_8_,iVar21);
          lVar19 = *plVar15;
          pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,iVar21);
          if (lVar19 < (int)pTVar13->lowerbound_) {
LAB_0055b114:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,
                           "\' has a default shape that is out of the specified shape range");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
            goto LAB_0055a06a;
          }
          pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,iVar21);
          if (-1 < pTVar13->upperbound_) {
            plVar15 = google::protobuf::RepeatedField<long>::Get
                                ((RepeatedField<long> *)local_e8._32_8_,iVar21);
            lVar19 = *plVar15;
            pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (&this_01->super_RepeatedPtrFieldBase,iVar21);
            if (pTVar13->upperbound_ < lVar19) goto LAB_0055b114;
          }
          iVar4 = (local_110->sizeranges_).super_RepeatedPtrFieldBase.current_size_;
        }
        goto LAB_0055ab9a;
      }
    }
LAB_0055abd2:
    pAVar5 = Specification::FeatureType::multiarraytype(this);
    iVar21 = pAVar5->datatype_;
    if (((iVar21 == 0x10020) || (iVar21 == 0x10040)) || (iVar21 == 0x20020)) {
      pAVar5 = Specification::FeatureType::multiarraytype(this);
      uVar1 = pAVar5->_oneof_case_[1];
      if (uVar1 == 0x29) {
        pAVar5 = Specification::FeatureType::multiarraytype(this);
        if (pAVar5->datatype_ == 0x20020) goto switchD_00559fee_caseD_1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       "\' has mistmatch between dataType and the type of default optional value.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
      }
      else if (uVar1 == 0x33) {
        pAVar5 = Specification::FeatureType::multiarraytype(this);
        if (pAVar5->datatype_ == 0x10020) goto switchD_00559fee_caseD_1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       "\' has mistmatch between dataType and the type of default optional value.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
      }
      else {
        if ((uVar1 != 0x3d) ||
           (pAVar5 = Specification::FeatureType::multiarraytype(this), pAVar5->datatype_ == 0x10040)
           ) {
switchD_00559fee_caseD_1:
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       "\' has mistmatch between dataType and the type of default optional value.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "Description of multiarray feature \'",(desc->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "\' has an invalid or unspecified dataType. It must be specified as DOUBLE, FLOAT32 or INT32"
                    );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    break;
  case 6:
    pDVar10 = Specification::FeatureType::dictionarytype(this);
    if (pDVar10->_oneof_case_[0] != 0) goto switchD_00559fee_caseD_1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "Description of dictionary feature \'",(desc->name_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "\' must contain a key type of either Int64 or String.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    break;
  case 7:
    if (2 < modelVersion) {
      pSVar11 = Specification::FeatureType::sequencetype(this);
      pSVar22 = pSVar11->sizerange_;
      if (pSVar22 == (SizeRange *)0x0) {
        pSVar22 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      validateSizeRange(&res,pSVar22);
      bVar3 = Result::good(&res);
      if (bVar3) {
        pSVar11 = Specification::FeatureType::sequencetype(this);
        if (pSVar11->_oneof_case_[0] != 0) {
          std::__cxx11::string::~string((string *)&res.m_message);
          goto switchD_00559fee_caseD_1;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"Description of sequence feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,
                       "\' has invalid or missing type. Only Int64 and String sequences are currently supported"
                      );
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
        std::__cxx11::string::~string((string *)local_138);
        this_02 = (string *)local_108;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_108 + 0x20),"Description of sequence feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_108 + 0x20),"\' has invalid allowed sizes. ");
        psVar12 = Result::message_abi_cxx11_(&res);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,psVar12);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::~string((string *)local_108);
        this_02 = (string *)(local_108 + 0x20);
      }
LAB_0055aa63:
      std::__cxx11::string::~string(this_02);
      pRVar23 = (Result *)&res.m_message;
      goto LAB_0055a079;
    }
    std::__cxx11::to_string((string *)(local_108 + 0x20),3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "Sequence types are only valid in specification verison >= ",
                   (string *)(local_108 + 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   ". This model has version ");
    std::__cxx11::to_string((string *)&local_c0,modelVersion);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    std::__cxx11::string::~string((string *)&res);
    std::__cxx11::string::~string((string *)&local_c0);
    pRVar23 = (Result *)local_138;
LAB_0055a5fa:
    std::__cxx11::string::~string((string *)pRVar23);
    std::__cxx11::string::~string((string *)local_108);
    pRVar23 = (Result *)(local_108 + 0x20);
    goto LAB_0055a079;
  }
LAB_0055a06a:
  std::__cxx11::string::~string((string *)&res);
  pRVar23 = (Result *)local_138;
LAB_0055a079:
  std::__cxx11::string::~string((string *)pRVar23);
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }